

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_ui_set_option(Nvim *this,string *name,Object *value)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"nvim_ui_set_option",&local_41);
  NvimRPC::
  async_call<std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_40,name,value);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Nvim::async_ui_set_option(const std::string& name, const Object& value) {
    client_.async_call("nvim_ui_set_option", name, value);
}